

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

bool __thiscall
pybind11::detail::argument_loader<sophia_interface*,bool,double,double,bool>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul>
          (argument_loader<sophia_interface*,bool,double,double,bool> *this,long call)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  handle hVar1;
  long lVar2;
  long lVar3;
  reference rVar4;
  char local_35 [4];
  bool local_31;
  
  hVar1.m_ptr = (PyObject *)**(undefined8 **)(call + 8);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(call + 0x20);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,0);
  local_35[0] = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                          ((type_caster_generic *)(this + 0x20),hVar1,
                           (*rVar4._M_p & rVar4._M_mask) != 0);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,1);
  local_35[1] = type_caster<bool,_void>::load
                          ((type_caster<bool,_void> *)(this + 0x18),hVar1,
                           (*rVar4._M_p & rVar4._M_mask) != 0);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x10);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,2);
  local_35[2] = type_caster<double,_void>::load
                          ((type_caster<double,_void> *)(this + 0x10),hVar1,
                           (*rVar4._M_p & rVar4._M_mask) != 0);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x18);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,3);
  local_35[3] = type_caster<double,_void>::load
                          ((type_caster<double,_void> *)(this + 8),hVar1,
                           (*rVar4._M_p & rVar4._M_mask) != 0);
  hVar1.m_ptr = *(PyObject **)(*(long *)(call + 8) + 0x20);
  rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,4);
  local_31 = type_caster<bool,_void>::load
                       ((type_caster<bool,_void> *)this,hVar1,(*rVar4._M_p & rVar4._M_mask) != 0);
  lVar2 = 0;
  do {
    lVar3 = lVar2;
    if (lVar3 == 5) break;
    lVar2 = lVar3 + 1;
  } while (local_35[lVar3] != '\0');
  return lVar3 == 5;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }